

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix3d> *value)

{
  bool bVar1;
  undefined1 local_70 [8];
  matrix3d v;
  optional<tinyusdz::value::matrix3d> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    tinyusdz::value::matrix3d::matrix3d((matrix3d *)local_70);
    bVar1 = ReadBasicType(this,(matrix3d *)local_70);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::operator=
                (value,(matrix3d *)local_70);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix3d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix3d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}